

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamToolsIndex::InitializeFileSummary(BamToolsIndex *this,int *numReferences)

{
  pointer pBVar1;
  int i;
  int iVar2;
  BtiReferenceSummary local_30;
  
  pBVar1 = (this->m_indexFileSummary).
           super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_indexFileSummary).
      super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
      ._M_impl.super__Vector_impl_data._M_finish != pBVar1) {
    (this->m_indexFileSummary).
    super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
    ._M_impl.super__Vector_impl_data._M_finish = pBVar1;
  }
  for (iVar2 = 0; iVar2 < *numReferences; iVar2 = iVar2 + 1) {
    local_30.NumBlocks = 0;
    local_30.FirstBlockFilePosition = 0;
    std::
    vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
    ::emplace_back<BamTools::Internal::BtiReferenceSummary>(&this->m_indexFileSummary,&local_30);
  }
  return;
}

Assistant:

void BamToolsIndex::InitializeFileSummary(const int& numReferences) {
    m_indexFileSummary.clear();
    for ( int i = 0; i < numReferences; ++i )
        m_indexFileSummary.push_back( BtiReferenceSummary() );
}